

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O1

void insert<32000u,vector_bagwell<unsigned_char*,16u>,BurstSimple<unsigned_short>,unsigned_short>
               (TrieNode<unsigned_short> *root,uchar **strings,size_t n)

{
  _WordT *p_Var1;
  TrieNode<unsigned_short> *pTVar2;
  pointer pppuVar3;
  ulong uVar4;
  ulong uVar5;
  vector_bagwell<unsigned_char_*,_16U> *pvVar6;
  TrieNode<unsigned_short> *pTVar7;
  byte bVar8;
  size_t sVar9;
  size_t depth;
  ulong uVar10;
  ulong uVar11;
  uchar *str;
  BurstSimple<unsigned_short> local_61;
  TrieNode<unsigned_short> *local_60;
  size_t local_58;
  uchar **local_50;
  vector_bagwell<unsigned_char_*,_16U> *local_48;
  size_t local_40;
  uchar *local_38;
  
  if (n != 0) {
    sVar9 = 0;
    local_60 = root;
    local_58 = n;
    local_50 = strings;
    do {
      local_38 = local_50[sVar9];
      if (local_38 == (uchar *)0x0) {
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (*local_38 == '\0') {
        uVar10 = 0;
      }
      else {
        uVar10 = (ulong)CONCAT11(*local_38,local_38[1]);
      }
      uVar5 = uVar10 >> 6;
      bVar8 = (byte)uVar10;
      depth = 2;
      uVar4 = (local_60->is_trie).super__Base_bitset<1024UL>._M_w[uVar5] >> (uVar10 & 0x3f);
      pTVar2 = local_60;
      while ((uVar4 & 1) != 0) {
        if ((char)uVar10 == '\0') {
          __assert_fail("not is_end(c)",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort.cpp"
                        ,0xdf,
                        "void insert(TrieNode<CharT> *, unsigned char **, size_t) [Threshold = 32000U, BucketT = vector_bagwell<unsigned char *>, BurstImpl = BurstSimple<unsigned short>, CharT = unsigned short]"
                       );
        }
        if (local_38[depth] == '\0') {
          uVar11 = 0;
        }
        else {
          uVar11 = (ulong)CONCAT11(local_38[depth],local_38[depth + 1]);
        }
        pTVar2 = (TrieNode<unsigned_short> *)(pTVar2->buckets)._M_elems[uVar10];
        bVar8 = (byte)uVar11;
        uVar5 = uVar11 >> 6;
        depth = depth + 2;
        uVar10 = uVar11;
        uVar4 = (pTVar2->is_trie).super__Base_bitset<1024UL>._M_w[uVar5] >> (uVar11 & 0x3f);
      }
      pvVar6 = (vector_bagwell<unsigned_char_*,_16U> *)(pTVar2->buckets)._M_elems[uVar10];
      local_40 = sVar9;
      if (pvVar6 == (vector_bagwell<unsigned_char_*,_16U> *)0x0) {
        pvVar6 = (vector_bagwell<unsigned_char_*,_16U> *)operator_new(0x28);
        (pvVar6->_index_block).
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pvVar6->_index_block).
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pvVar6->_index_block).
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pvVar6->_insertpos = (uchar **)0x0;
        pvVar6->_left_in_block = 0;
        (pTVar2->buckets)._M_elems[uVar10] = pvVar6;
      }
      local_48 = pvVar6;
      vector_bagwell<unsigned_char_*,_16U>::push_back(pvVar6,&local_38);
      pvVar6 = local_48;
      if ((((char)uVar10 != '\0') && (local_48->_insertpos != (uchar **)0x0)) &&
         (pppuVar3 = (local_48->_index_block).
                     super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl
                     .super__Vector_impl_data._M_finish,
         0x3e800 < (ulong)((long)local_48->_insertpos +
                          ((long)((1 << ((char)((uint)((int)pppuVar3 -
                                                      *(int *)&(local_48->_index_block).
                                                                                                                              
                                                  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) +
                                         3U & 0x1f)) + -0x10) * 8 - (long)pppuVar3[-1])))) {
        pTVar7 = BurstSimple<unsigned_short>::operator()(&local_61,local_48,depth);
        (pTVar2->buckets)._M_elems[uVar10] = pTVar7;
        p_Var1 = (pTVar2->is_trie).super__Base_bitset<1024UL>._M_w + uVar5;
        *p_Var1 = *p_Var1 | 1L << (bVar8 & 0x3f);
        vector_bagwell<unsigned_char_*,_16U>::~vector_bagwell(pvVar6);
        operator_delete(pvVar6);
      }
      sVar9 = local_40 + 1;
    } while (sVar9 != local_58);
  }
  return;
}

Assistant:

static inline void
insert(TrieNode<CharT>* root, unsigned char** strings, size_t n)
{
	for (size_t i=0; i < n; ++i) {
		unsigned char* str = strings[i];
		size_t depth = 0;
		CharT c = get_char<CharT>(str, 0);
		TrieNode<CharT>* node = root;
		while (node->is_trie[c]) {
			assert(not is_end(c));
			node = static_cast<TrieNode<CharT>*>(node->buckets[c]);
			depth += sizeof(CharT);
			c = get_char<CharT>(str, depth);
		}
		BucketT* bucket = static_cast<BucketT*>(node->buckets[c]);
		if (not bucket) {
			node->buckets[c] = bucket = new BucketT;
		}
		bucket->push_back(str);
		if (is_end(c)) continue;
		if (bucket->size() > Threshold) {
			node->buckets[c] = BurstImpl()(*bucket,
					depth+sizeof(CharT));
			node->is_trie[c] = true;
			delete bucket;
		}
	}
}